

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_clr(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  int opsize_00;
  TCGv_i32 val;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  TCGv_i32 zero;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = tcg_const_i32_m68k(tcg_ctx_00,0);
  opsize_00 = insn_opsize((uint)insn);
  pTVar1 = gen_ea(env,s,insn,opsize_00,val,(TCGv_i32 *)0x0,EA_STORE,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (pTVar1 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    gen_logic_cc(s,val,opsize_00);
    tcg_temp_free_i32(tcg_ctx_00,val);
  }
  return;
}

Assistant:

DISAS_INSN(clr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv zero;

    zero = tcg_const_i32(tcg_ctx, 0);

    opsize = insn_opsize(insn);
    DEST_EA(env, insn, opsize, zero, NULL);
    gen_logic_cc(s, zero, opsize);
    tcg_temp_free(tcg_ctx, zero);
}